

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O2

string * __thiscall
pbrt::PaddedSobolSampler::ToString_abi_cxx11_
          (string *__return_storage_ptr__,PaddedSobolSampler *this)

{
  RandomizeStrategy *in_stack_fffffffffffffff0;
  
  StringPrintf<pbrt::Point2<int>const&,int_const&,int_const&,int_const&,pbrt::RandomizeStrategy_const&>
            (__return_storage_ptr__,
             (pbrt *)
             "[ PaddedSobolSampler pixel: %s sampleIndex: %d dimension: %d samplesPerPixel: %d randomizeStrategy: %s ]"
             ,(char *)&this->pixel,(Point2<int> *)&this->sampleIndex,&this->dimension,
             &this->samplesPerPixel,(int *)&this->randomizeStrategy,in_stack_fffffffffffffff0);
  return __return_storage_ptr__;
}

Assistant:

std::string PaddedSobolSampler::ToString() const {
    return StringPrintf("[ PaddedSobolSampler pixel: %s sampleIndex: %d dimension: %d "
                        "samplesPerPixel: %d randomizeStrategy: %s ]",
                        pixel, sampleIndex, dimension, samplesPerPixel,
                        randomizeStrategy);
}